

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UCIAdapter.cpp
# Opt level: O3

void __thiscall senjo::UCIAdapter::StopCommand(UCIAdapter *this,char *params)

{
  size_t sVar1;
  int iVar2;
  Output local_20;
  
  sVar1 = DAT_001b07b8;
  if (params != (char *)0x0 && DAT_001b07b8 != 0) {
    iVar2 = strncmp(params,token::Help_abi_cxx11_,DAT_001b07b8);
    if (iVar2 == 0) {
      if (params[sVar1] != '\0') {
        iVar2 = isspace((int)params[sVar1]);
        if (iVar2 == 0) goto LAB_0013c0a2;
      }
      Output::Output(&local_20,InfoPrefix);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"usage: ",7);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,token::Stop_abi_cxx11_,DAT_001b0998);
      Output::~Output(&local_20);
      Output::Output(&local_20,InfoPrefix);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Stop engine if it is calculating.",0x21);
      Output::~Output(&local_20);
      return;
    }
  }
LAB_0013c0a2:
  (*this->engine->_vptr_ChessEngine[0x1f])(this->engine,1);
  Thread::Join(&this->thread);
  return;
}

Assistant:

void UCIAdapter::StopCommand(const char* params)
{
  if (ParamMatch(token::Help, params)) {
    Output() << "usage: " << token::Stop;
    Output() << "Stop engine if it is calculating.";
    return;
  }

  engine->Stop(ChessEngine::FullStop);
  thread.Join();
}